

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O3

void FuzzyHammerer::do_random_accesses
               (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *random_rows,
               int duration_us)

{
  long lVar1;
  long lVar2;
  pointer ppcVar3;
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> *__range2;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  while( true ) {
    lVar2 = std::chrono::_V2::system_clock::now();
    if ((long)duration_us + lVar1 / 1000 <= lVar2 / 1000) break;
    for (ppcVar3 = (random_rows->
                   super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar3 !=
        (random_rows->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>)._M_impl
        .super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    }
  }
  return;
}

Assistant:

void FuzzyHammerer::do_random_accesses(const std::vector<volatile char *> &random_rows, const int duration_us) {
  const auto random_access_limit = get_timestamp_us() + static_cast<int64_t>(duration_us);
  while (get_timestamp_us() < random_access_limit) {
    for (volatile char *e : random_rows) {
      (void)*e; // this should be fine as random_rows are volatile
    }
  }
}